

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  
  iVar1 = (message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = 0 < iVar1;
  if (0 < iVar1) {
    bVar2 = AddNestedExtensions(this,(DescriptorProto *)
                                     *(message_type->nested_type_).super_RepeatedPtrFieldBase.
                                      elements_,value);
    if (bVar2) {
      lVar5 = 1;
      do {
        lVar3 = (long)(message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        bVar4 = lVar5 < lVar3;
        if (lVar3 <= lVar5) goto LAB_001f9399;
        bVar2 = AddNestedExtensions(this,(DescriptorProto *)
                                         (message_type->nested_type_).super_RepeatedPtrFieldBase.
                                         elements_[lVar5],value);
        lVar5 = lVar5 + 1;
      } while (bVar2);
    }
    if (bVar4) {
      return false;
    }
  }
LAB_001f9399:
  iVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = iVar1 < 1;
  if ((0 < iVar1) &&
     (bVar2 = AddExtension(this,(FieldDescriptorProto *)
                                *(message_type->extension_).super_RepeatedPtrFieldBase.elements_,
                           value), bVar2)) {
    lVar5 = 1;
    do {
      lVar3 = (long)(message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = lVar3 <= lVar5;
      if (lVar3 <= lVar5) {
        return bVar4;
      }
      bVar2 = AddExtension(this,(FieldDescriptorProto *)
                                (message_type->extension_).super_RepeatedPtrFieldBase.elements_
                                [lVar5],value);
      lVar5 = lVar5 + 1;
    } while (bVar2);
  }
  return bVar4;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(message_type.nested_type(i), value)) return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(message_type.extension(i), value)) return false;
  }
  return true;
}